

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

ulong __thiscall
nuraft::raft_server::store_log_entry(raft_server *this,ptr<log_entry> *entry,ulong index)

{
  log_val_type lVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  srv_role sVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  element_type *this_00;
  element_type *peVar7;
  element_type *peVar8;
  ulong in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ulong log_index;
  size_t in_stack_00000120;
  ulong in_stack_00000128;
  raft_server *in_stack_00000130;
  string local_40 [32];
  ulong local_20;
  undefined8 local_10;
  
  local_10 = in_RSI;
  if (in_RDX == 0) {
    peVar6 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x32dcc0);
    iVar3 = (*peVar6->_vptr_log_store[5])(peVar6,local_10);
    local_20 = CONCAT44(extraout_var,iVar3);
  }
  else {
    local_20 = in_RDX;
    peVar6 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x32dce6);
    (*peVar6->_vptr_log_store[6])(peVar6,local_20,local_10);
  }
  this_00 = std::__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x32dd03);
  lVar1 = log_entry::get_val_type(this_00);
  if (lVar1 == conf) {
    peVar6 = std::__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x32dd28);
    uVar4 = (*peVar6->_vptr_log_store[0x10])();
    if ((uVar4 & 1) == 0) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x32dd67);
        iVar3 = (*peVar7->_vptr_logger[7])();
        if (0 < iVar3) {
          peVar7 = std::
                   __shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x32dd8a);
          msg_if_given_abi_cxx11_((char *)local_40,"log store flush failed");
          (*peVar7->_vptr_logger[8])
                    (peVar7,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"store_log_entry",0x68a,local_40);
          std::__cxx11::string::~string(local_40);
        }
      }
      std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
                ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x32de0a);
      peVar8 = std::__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x32de12);
      (*peVar8->_vptr_state_mgr[8])(peVar8,0xffffffeb);
    }
    sVar5 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x32de31);
    if (sVar5 == leader) {
      try_update_precommit_index(in_stack_00000130,in_stack_00000128,in_stack_00000120);
    }
  }
  return local_20;
}

Assistant:

ulong raft_server::store_log_entry(ptr<log_entry>& entry, ulong index) {
    ulong log_index = index;
    if (index == 0) {
        log_index = log_store_->append(entry);
    } else {
        log_store_->write_at(log_index, entry);
    }

    if ( entry->get_val_type() == log_val_type::conf ) {
        // Force persistence of config_change logs to guarantee the durability of
        // cluster membership change log entries.  Losing cluster membership log
        // entries may lead to split brain.
        if ( !log_store_->flush() ) {
            // LCOV_EXCL_START
            p_ft("log store flush failed");
            ctx_->state_mgr_->system_exit(N21_log_flush_failed);
            // LCOV_EXCL_STOP
        }

        if ( role_ == srv_role::leader ) {
            // Need to progress precommit index for config.
            try_update_precommit_index(log_index);
        }
    }

    return log_index;
}